

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

int __thiscall CVmFormatterLog::close_log_file(CVmFormatterLog *this)

{
  undefined8 uVar1;
  void *pvVar2;
  undefined8 *puVar3;
  long *plVar4;
  int in_ESI;
  long in_RDI;
  err_frame_t err_cur__;
  int err;
  uint local_f0 [2];
  undefined8 local_e8;
  void *local_e0;
  __jmp_buf_tag _Stack_d8;
  int local_c;
  
  local_c = 0;
  if (*(long *)(in_RDI + 0xf040) != 0) {
    fclose(*(FILE **)(in_RDI + 0xf040));
    *(undefined8 *)(in_RDI + 0xf040) = 0;
  }
  if (*(long *)(in_RDI + 0xf048) != 0) {
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    local_e8 = *puVar3;
    plVar4 = (long *)_ZTW11G_err_frame();
    *plVar4 = (long)local_f0;
    local_f0[0] = _setjmp(&_Stack_d8);
    if (local_f0[0] == 0) {
      CVmNetFile::close(*(CVmNetFile **)(in_RDI + 0xf048),in_ESI);
    }
    uVar1 = local_e8;
    if (local_f0[0] == 1) {
      local_f0[0] = 2;
      local_c = 1;
    }
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    *puVar3 = uVar1;
    if ((local_f0[0] & 0x4001) != 0) {
      puVar3 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(uint *)*puVar3 & 2) != 0) {
        plVar4 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar4 + 0x10));
      }
      pvVar2 = local_e0;
      plVar4 = (long *)_ZTW11G_err_frame();
      *(void **)(*plVar4 + 0x10) = pvVar2;
      err_rethrow();
    }
    if ((local_f0[0] & 2) != 0) {
      free(local_e0);
    }
    *(undefined8 *)(in_RDI + 0xf048) = 0;
  }
  if (*(long *)(in_RDI + 0xf050) != 0) {
    vm_val_t::set_nil(*(vm_val_t **)(in_RDI + 0xf050));
  }
  return local_c;
}

Assistant:

int CVmFormatterLog::close_log_file(VMG0_)
{
    /* presume success */
    int err = FALSE;
    
    /* if we have a file, close it */
    if (logfp_ != 0)
    {
        /* close and forget the handle */
        osfcls(logfp_);
        logfp_ = 0;
    }

    /* forget the log network file descriptor, if we have one */
    if (lognf_ != 0)
    {
        err_try
        {
            lognf_->close(vmg0_);
        }
        err_catch_disc
        {
            /* flag the error, but otherwise discard the exception */
            err = TRUE;
        }